

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O0

void ignore_drop(player *p)

{
  loc_conflict grid;
  _Bool _Var1;
  uint uVar2;
  char *src;
  quark_t qVar3;
  command *cmd;
  command_conflict *drop_cmd;
  char buffer [1024];
  char *inscription;
  object *obj;
  player *p_local;
  
  inscription = (char *)gear_last_item(p);
  while( true ) {
    if (inscription == (char *)0x0) {
      p->upkeep->update = p->upkeep->update | 0x400;
      p->upkeep->notice = p->upkeep->notice | 1;
      return;
    }
    if (*(long *)inscription == 0) break;
    _Var1 = ignore_item_ok(p,(object *)inscription);
    if (((_Var1) && (uVar2 = check_for_inscrip((object *)inscription,"!d"), uVar2 == 0)) &&
       (uVar2 = check_for_inscrip((object *)inscription,"!*"), uVar2 == 0)) {
      _Var1 = object_is_equipped(p->body,(object *)inscription);
      if ((!_Var1) ||
         (_Var1 = verify_object("Really take off and drop",(object *)inscription,p), _Var1)) {
        grid.x = (p->grid).x;
        grid.y = (p->grid).y;
        _Var1 = square_isshop((chunk *)cave,grid);
        if (!_Var1) {
          p->upkeep->dropping = true;
          cmdq_push(CMD_DROP);
          cmd = cmdq_peek();
          if (cmd == (command *)0x0) {
            __assert_fail("drop_cmd",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-ignore.c"
                          ,0x29d,"void ignore_drop(struct player *)");
          }
          cmd_set_arg_item(cmd,"item",(object *)inscription);
          cmd_set_arg_number(cmd,"quantity",(uint)(byte)inscription[0x12a]);
          cmd->background_command = 2;
        }
      }
      else {
        src = quark_str(*(quark_t *)(inscription + 0x140));
        if (src == (char *)0x0) {
          qVar3 = quark_add("!d");
          *(quark_t *)(inscription + 0x140) = qVar3;
        }
        else {
          my_strcpy((char *)&drop_cmd,src,0x400);
          my_strcat((char *)&drop_cmd,"!d",0x400);
          qVar3 = quark_add((char *)&drop_cmd);
          *(quark_t *)(inscription + 0x140) = qVar3;
        }
      }
    }
    inscription = *(char **)(inscription + 0x18);
  }
  __assert_fail("obj->kind",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-ignore.c"
                ,0x27d,"void ignore_drop(struct player *)");
}

Assistant:

void ignore_drop(struct player *p)
{
	struct object *obj;

	/* Scan through the slots backwards */
	for (obj = gear_last_item(p); obj; obj = obj->prev) {
		/* Skip non-objects and unignoreable objects */
		assert(obj->kind);
		if (!ignore_item_ok(p, obj)) continue;

		/* Check for !d (no drop) inscription */
		if (!check_for_inscrip(obj, "!d") && !check_for_inscrip(obj, "!*")) {
			/* Confirm the drop if the item is equipped. */
			if (object_is_equipped(p->body, obj)) {
				if (!verify_object("Really take off and drop", obj, p)) {
					/* Hack - inscribe the item with !d to prevent repeated
					 * confirmations. */
					const char *inscription = quark_str(obj->note);

					if (inscription == NULL) {
						obj->note = quark_add("!d");
					} else {
						char buffer[1024];
						my_strcpy(buffer, inscription, sizeof(buffer));
						my_strcat(buffer, "!d", sizeof(buffer));
						obj->note = quark_add(buffer);
					}

					continue;
				}
			}

			/* We're allowed to drop it. */
			if (!square_isshop(cave, p->grid)) {
				struct command *drop_cmd;

				p->upkeep->dropping = true;
				cmdq_push(CMD_DROP);
				drop_cmd = cmdq_peek();
				assert(drop_cmd);
				cmd_set_arg_item(drop_cmd, "item", obj);
				cmd_set_arg_number(drop_cmd, "quantity",
					obj->number);
				/*
				 * This drop is a side effect:  whatever
				 * command triggered it will be the target
				 * for CMD_REPEAT rather than repeating the
				 * drop, and the drop will not trigger
				 * bloodlust.
				 */
				drop_cmd->background_command = 2;
			}
		}
	}

	/* Update the gear */
	p->upkeep->update |= (PU_INVEN);

	/* Combine/reorder the pack */
	p->upkeep->notice |= (PN_COMBINE);
}